

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_node **ppsVar1;
  stbrp_rect *psVar2;
  uint uVar3;
  stbrp_node *psVar4;
  stbrp_context *psVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  stbrp_node **ppsVar10;
  int *piVar11;
  stbrp_node *psVar12;
  stbrp_node *compare_func;
  long lVar13;
  int *piVar14;
  stbrp_node **ppsVar15;
  int iVar16;
  int *piVar17;
  int iVar18;
  ulong uVar19;
  stbrp_context *psVar20;
  stbrp_context *psVar21;
  uint local_8c;
  uint local_88;
  int local_84;
  stbrp_node **local_80;
  int local_50;
  int waste;
  size_t local_48;
  ulong local_40;
  stbrp_rect *local_38;
  
  uVar9 = 0;
  uVar19 = 0;
  if (0 < num_rects) {
    uVar19 = (ulong)(uint)num_rects;
  }
  compare_func = (stbrp_node *)&rects->was_packed;
  for (; uVar19 != uVar9; uVar9 = uVar9 + 1) {
    compare_func->x = (int)uVar9;
    compare_func = (stbrp_node *)((long)compare_func + 0x18);
  }
  local_48 = (size_t)num_rects;
  ImQsort(rects,local_48,0x1772f5,(_func_int_void_ptr_void_ptr *)compare_func);
  ppsVar1 = &context->active_head;
  uVar9 = 0;
  local_40 = uVar19;
  local_38 = rects;
  do {
    piVar14 = (int *)0xc;
    if (uVar9 == uVar19) {
      ImQsort(rects,local_48,0x177319,(_func_int_void_ptr_void_ptr *)compare_func);
      for (lVar13 = 0; uVar19 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
        uVar7 = 1;
        if (*(int *)((long)&rects->x + lVar13) == 0x7fffffff) {
          uVar7 = (uint)(*(int *)((long)&rects->y + lVar13) != 0x7fffffff);
        }
        *(uint *)((long)&rects->was_packed + lVar13) = uVar7;
      }
      return (int)(uVar19 * 0x18);
    }
    psVar2 = rects + uVar9;
    iVar18 = rects[uVar9].w;
    piVar11 = (int *)0x10;
    if (iVar18 == 0) {
      uVar7 = 0;
      uVar8 = 0;
    }
    else {
      uVar3 = psVar2->h;
      uVar7 = 0;
      uVar8 = 0;
      if (uVar3 != 0) {
        uVar7 = context->align;
        iVar16 = iVar18 + uVar7 + -1;
        iVar16 = iVar16 - iVar16 % (int)uVar7;
        if (iVar16 % (int)uVar7 != 0) {
          __assert_fail("width % c->align == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imstb_rectpack.h"
                        ,0x164,
                        "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)")
          ;
        }
        iVar6 = context->width;
        compare_func = (stbrp_node *)(ulong)uVar7;
        if ((iVar16 <= iVar6) &&
           (compare_func = (stbrp_node *)(ulong)uVar3, (int)uVar3 <= context->height)) {
          psVar21 = (stbrp_context *)*ppsVar1;
          local_84 = 0x40000000;
          local_8c = 0x40000000;
          local_80 = (stbrp_node **)0x0;
          ppsVar15 = ppsVar1;
          for (; psVar21->width + iVar16 <= iVar6; psVar21 = *(stbrp_context **)&psVar21->align) {
            uVar7 = stbrp__skyline_find_min_y
                              (psVar21,(stbrp_node *)(ulong)(uint)psVar21->width,iVar16,(int)&waste,
                               piVar14);
            if (context->heuristic == 0) {
              if ((int)uVar7 < (int)local_8c) {
                local_8c = uVar7;
                local_80 = ppsVar15;
              }
            }
            else if (((int)(uVar3 + uVar7) <= context->height) &&
                    (((int)uVar7 < (int)local_8c || (waste < local_84 && uVar7 == local_8c)))) {
              local_84 = waste;
              local_8c = uVar7;
              local_80 = ppsVar15;
            }
            ppsVar15 = (stbrp_node **)&psVar21->align;
            iVar6 = context->width;
          }
          if (local_80 == (stbrp_node **)0x0) {
            local_88 = 0;
          }
          else {
            local_88 = (*local_80)->x;
          }
          piVar14 = (int *)0xc;
          if (context->heuristic == 1) {
            psVar21 = (stbrp_context *)*ppsVar1;
            for (psVar20 = psVar21; ppsVar15 = ppsVar1, psVar20->width < iVar16;
                psVar20 = *(stbrp_context **)&psVar20->align) {
            }
            for (; rects = local_38, uVar19 = local_40, psVar20 != (stbrp_context *)0x0;
                psVar20 = *(stbrp_context **)&psVar20->align) {
              uVar7 = psVar20->width - iVar16;
              psVar5 = psVar21;
              if ((int)uVar7 < 0) {
                __assert_fail("xpos >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imstb_rectpack.h"
                              ,0x1a4,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              do {
                psVar21 = psVar5;
                ppsVar10 = ppsVar15;
                ppsVar15 = (stbrp_node **)&psVar21->align;
                psVar5 = *(stbrp_context **)&psVar21->align;
              } while ((*(stbrp_context **)&psVar21->align)->width <= (int)uVar7);
              if ((int)uVar7 < psVar21->width) {
                __assert_fail("node->next->x > xpos && node->x <= xpos",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imstb_rectpack.h"
                              ,0x1aa,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              uVar8 = stbrp__skyline_find_min_y
                                (psVar21,(stbrp_node *)(ulong)uVar7,iVar16,(int)&local_50,piVar14);
              if ((((int)(uVar3 + uVar8) <= context->height) && ((int)uVar8 <= (int)local_8c)) &&
                 (((uVar8 < local_8c || (local_50 < local_84)) ||
                  ((local_50 == local_84 && ((int)uVar7 < (int)local_88)))))) {
                local_84 = local_50;
                local_8c = uVar8;
                local_88 = uVar7;
                local_80 = ppsVar10;
              }
              ppsVar15 = ppsVar10;
            }
          }
          piVar17 = (int *)0x10;
          piVar14 = (int *)0xc;
          compare_func = (stbrp_node *)local_80;
          if ((local_80 != (stbrp_node **)0x0) && ((int)(uVar3 + local_8c) <= context->height)) {
            compare_func = context->free_head;
            piVar11 = piVar17;
            uVar7 = 0x7fffffff;
            uVar8 = 0x7fffffff;
            if (compare_func != (stbrp_node *)0x0) {
              compare_func->x = local_88;
              compare_func->y = uVar3 + local_8c;
              context->free_head = compare_func->next;
              psVar4 = *local_80;
              psVar12 = psVar4;
              if (psVar4->x < (int)local_88) {
                psVar12 = psVar4->next;
                local_80 = &psVar4->next;
              }
              *local_80 = compare_func;
              iVar18 = iVar18 + local_88;
              while ((psVar4 = psVar12->next, psVar4 != (stbrp_node *)0x0 && (psVar4->x <= iVar18)))
              {
                psVar12->next = context->free_head;
                context->free_head = psVar12;
                psVar12 = psVar4;
              }
              compare_func->next = psVar12;
              piVar11 = piVar14;
              piVar14 = piVar17;
              uVar7 = local_88;
              uVar8 = local_8c;
              if (psVar12->x < iVar18) {
                psVar12->x = iVar18;
              }
            }
            goto LAB_00172368;
          }
        }
        piVar11 = (int *)0x10;
        piVar14 = (int *)0xc;
        uVar7 = 0x7fffffff;
        uVar8 = 0x7fffffff;
      }
    }
LAB_00172368:
    *(uint *)((long)&psVar2->id + (long)piVar11) = uVar7;
    *(uint *)((long)&psVar2->id + (long)piVar14) = uVar8;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}